

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.hpp
# Opt level: O0

void __thiscall
helics::InputInfo::InputInfo
          (InputInfo *this,GlobalHandle handle,string_view key_,string_view type_,string_view units_
          )

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_31 [49];
  
  *in_RDI = in_RSI;
  __a = local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,__a);
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffbb;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffba);
  *(undefined1 *)(in_RDI + 0xd) = 0;
  *(undefined1 *)((long)in_RDI + 0x69) = 0;
  *(undefined1 *)((long)in_RDI + 0x6a) = 0;
  *(undefined1 *)((long)in_RDI + 0x6b) = 0;
  *(undefined1 *)((long)in_RDI + 0x6c) = 0;
  *(undefined1 *)((long)in_RDI + 0x6d) = 0;
  *(undefined1 *)((long)in_RDI + 0x6e) = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  in_RDI[0xf] = 0;
  std::
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
            *)0x5cb649);
  std::
  vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
  ::vector((vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
            *)0x5cb65a);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::vector
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)0x5cb66b);
  std::
  vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
  ::vector((vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
            *)0x5cb67c);
  std::
  vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
  ::vector((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
            *)0x5cb68d);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5cb69e);
  std::
  vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
  ::vector((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
            *)0x5cb6af);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  return;
}

Assistant:

InputInfo(GlobalHandle handle,
              std::string_view key_,
              std::string_view type_,
              std::string_view units_): id(handle), key(key_), type(type_), units(units_)
    {
    }